

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

HANDLE CreateThread(LPSECURITY_ATTRIBUTES lpThreadAttributes,DWORD dwStackSize,
                   LPTHREAD_START_ROUTINE lpStartAddress,LPVOID lpParameter,DWORD dwCreationFlags,
                   LPDWORD lpThreadId)

{
  SIZE_T local_58;
  SIZE_T osThreadId;
  HANDLE hNewThread;
  CPalThread *pThread;
  LPDWORD pDStack_38;
  PAL_ERROR palError;
  LPDWORD lpThreadId_local;
  LPVOID pvStack_28;
  DWORD dwCreationFlags_local;
  LPVOID lpParameter_local;
  LPTHREAD_START_ROUTINE lpStartAddress_local;
  LPSECURITY_ATTRIBUTES p_Stack_10;
  DWORD dwStackSize_local;
  LPSECURITY_ATTRIBUTES lpThreadAttributes_local;
  
  osThreadId = 0;
  pDStack_38 = lpThreadId;
  lpThreadId_local._4_4_ = dwCreationFlags;
  pvStack_28 = lpParameter;
  lpParameter_local = lpStartAddress;
  lpStartAddress_local._4_4_ = dwStackSize;
  p_Stack_10 = lpThreadAttributes;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  hNewThread = CorUnix::InternalGetCurrentThread();
  local_58 = 0;
  pThread._4_4_ =
       CorUnix::InternalCreateThread
                 ((CPalThread *)hNewThread,p_Stack_10,lpStartAddress_local._4_4_,
                  (LPTHREAD_START_ROUTINE)lpParameter_local,pvStack_28,lpThreadId_local._4_4_,
                  UserCreatedThread,&local_58,(HANDLE *)&osThreadId);
  if (pThread._4_4_ != 0) {
    CorUnix::CPalThread::SetLastError(pThread._4_4_);
  }
  if (pDStack_38 != (LPDWORD)0x0) {
    *pDStack_38 = (DWORD)local_58;
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return (HANDLE)osThreadId;
}

Assistant:

HANDLE
PALAPI
CreateThread(
    IN LPSECURITY_ATTRIBUTES lpThreadAttributes,
    IN DWORD dwStackSize,
    IN LPTHREAD_START_ROUTINE lpStartAddress,
    IN LPVOID lpParameter,
    IN DWORD dwCreationFlags,
    OUT LPDWORD lpThreadId)
{
    PAL_ERROR palError;
    CPalThread *pThread;
    HANDLE hNewThread = NULL;

    PERF_ENTRY(CreateThread);
    ENTRY("CreateThread(lpThreadAttr=%p, dwStackSize=%u, lpStartAddress=%p, "
          "lpParameter=%p, dwFlags=%#x, lpThreadId=%#x)\n",
          lpThreadAttributes, dwStackSize, lpStartAddress, lpParameter,
          dwCreationFlags, lpThreadId);

    pThread = InternalGetCurrentThread();

    SIZE_T osThreadId = 0;
    palError = InternalCreateThread(
        pThread,
        lpThreadAttributes,
        dwStackSize,
        lpStartAddress,
        lpParameter,
        dwCreationFlags,
        UserCreatedThread,
        &osThreadId,
        &hNewThread
        );

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }
    if(lpThreadId != nullptr)
    {
        *lpThreadId = osThreadId;
    }
    LOGEXIT("CreateThread returns HANDLE %p\n", hNewThread);
    PERF_EXIT(CreateThread);

    return hNewThread;
}